

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::Int64ToDoubleMap::ByteSizeLong(Int64ToDoubleMap *this)

{
  long *key;
  int iVar1;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
  *pMVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
  *pMVar6;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
  *this_00;
  const_iterator it;
  iterator_base<google::protobuf::Map<long,_double>::KeyValuePair> local_58;
  iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair> local_40;
  
  local_58.m_ = (this->map_).map_.elements_;
  sVar5 = (size_t)(uint)(local_58.m_)->num_elements_;
  google::protobuf::Map<long,_double>::InnerMap::
  iterator_base<google::protobuf::Map<long,_double>::KeyValuePair>::SearchFrom
            (&local_58,(local_58.m_)->index_of_first_non_null_);
  local_40.node_._0_4_ = local_58.node_._0_4_;
  local_40.node_._4_4_ = local_58.node_._4_4_;
  local_40.m_._0_4_ = local_58.m_._0_4_;
  local_40.m_._4_4_ = local_58.m_._4_4_;
  local_40.bucket_index_ = local_58.bucket_index_;
  pMVar6 = (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
            *)0x0;
  while( true ) {
    if (CONCAT44(local_40.node_._4_4_,local_40.node_._0_4_) == 0) {
      if (pMVar6 != (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
                     *)0x0) {
        (*(((MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
             *)&pMVar6->super_MessageLite)->super_MessageLite)._vptr_MessageLite[1])(pMVar6);
      }
      this->_cached_size_ = (int)sVar5;
      return sVar5;
    }
    key = *(long **)(CONCAT44(local_40.node_._4_4_,local_40.node_._0_4_) + 8);
    pMVar2 = &google::protobuf::internal::
              MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
              ::Wrap(key,(double *)(key + 1),(this->map_).arena_)->
              super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ;
    this_00 = pMVar6;
    if ((pMVar6 != pMVar2) &&
       (this_00 = pMVar2,
       pMVar6 != (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
                  *)0x0)) {
      (*(((MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
           *)&pMVar6->super_MessageLite)->super_MessageLite)._vptr_MessageLite[1])(pMVar6);
    }
    if (this_00 ==
        (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
         *)0x0) break;
    sVar3 = google::protobuf::internal::
            MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
            ::ByteSizeLong(this_00);
    uVar4 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = sVar5 + sVar3 + (ulong)(iVar1 * 9 + 0x49U >> 6);
    google::protobuf::Map<long,_double>::InnerMap::
    iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair>::operator++(&local_40);
    pMVar6 = this_00;
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5b,
                "C &google::protobuf::internal::scoped_ptr<google::protobuf::internal::MapEntryLite<long, double, google::protobuf::internal::WireFormatLite::TYPE_INT64, google::protobuf::internal::WireFormatLite::TYPE_DOUBLE, 0>>::operator*() const [C = google::protobuf::internal::MapEntryLite<long, double, google::protobuf::internal::WireFormatLite::TYPE_INT64, google::protobuf::internal::WireFormatLite::TYPE_DOUBLE, 0>]"
               );
}

Assistant:

size_t Int64ToDoubleMap::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Int64ToDoubleMap)
  size_t total_size = 0;

  // map<int64, double> map = 1;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->map_size());
  {
    ::google::protobuf::scoped_ptr<Int64ToDoubleMap_MapEntry> entry;
    for (::google::protobuf::Map< ::google::protobuf::int64, double >::const_iterator
        it = this->map().begin();
        it != this->map().end(); ++it) {
      entry.reset(map_.NewEntryWrapper(it->first, it->second));
      total_size += ::google::protobuf::internal::WireFormatLite::
          MessageSizeNoVirtual(*entry);
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}